

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O1

void __thiscall CSocekt::msgSend(CSocekt *this,char *psendbuf)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  SourceFile file;
  Logger local_ff0;
  
  muduo::MutexLock::lock(&this->m_sendMessageQueueMutex);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)psendbuf;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->m_MsgSendQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node
            ._M_size;
  *psVar1 = *psVar1 + 1;
  LOCK();
  (this->m_iSendMsgQueueCount).value_ = (this->m_iSendMsgQueueCount).value_ + 1;
  UNLOCK();
  iVar2 = sem_post((sem_t *)&this->m_semEventSendQueue);
  if (iVar2 == -1) {
    file._8_8_ = 0xe;
    file.data_ = "flyd_socket.cc";
    muduo::Logger::Logger(&local_ff0,file,0x151,ERROR);
    if (0x3a < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,
                      "CSocekt::msgSend()中sem_post(&m_semEventSendQueue)失败.",0x3a);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x3a;
    }
    muduo::Logger::~Logger(&local_ff0);
  }
  (this->m_sendMessageQueueMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_sendMessageQueueMutex);
  return;
}

Assistant:

void CSocekt::msgSend(char *psendbuf) 
{
    muduo::MutexLockGuard lock(m_sendMessageQueueMutex);
    m_MsgSendQueue.push_back(psendbuf);    
    m_iSendMsgQueueCount.increment();   //原子操作

    //将信号量的值+1,这样其他卡在sem_wait的就可以走下去
    if(sem_post(&m_semEventSendQueue)==-1)  //让ServerSendQueueThread()流程走下来干活
    {
        LOG_ERROR << "CSocekt::msgSend()中sem_post(&m_semEventSendQueue)失败.";
   
    }
    return;
}